

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O0

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStructRMW
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,StructRMW *curr,
          optional<wasm::HeapType> ht)

{
  uint uVar1;
  bool bVar2;
  HeapType *pHVar3;
  size_type sVar4;
  Expression **ppEVar5;
  const_reference pvVar6;
  Type local_40;
  Struct *local_38;
  FieldList *fields;
  StructRMW *local_28;
  StructRMW *curr_local;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this_local;
  optional<wasm::HeapType> ht_local;
  
  this_local = ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType>._M_payload;
  ht_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
       ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_engaged;
  local_28 = curr;
  curr_local = (StructRMW *)this;
  bVar2 = std::optional::operator_cast_to_bool((optional *)&this_local);
  if (!bVar2) {
    fields = (FieldList *)wasm::Type::getHeapType(&local_28->ref->type);
    std::optional<wasm::HeapType>::operator=
              ((optional<wasm::HeapType> *)&this_local,(HeapType *)&fields);
  }
  pHVar3 = std::optional<wasm::HeapType>::operator->((optional<wasm::HeapType> *)&this_local);
  local_38 = HeapType::getStruct(pHVar3);
  uVar1 = local_28->index;
  sVar4 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(&local_38->fields);
  if (uVar1 < sVar4) {
    ppEVar5 = &local_28->ref;
    pHVar3 = std::optional<wasm::HeapType>::operator*((optional<wasm::HeapType> *)&this_local);
    wasm::Type::Type(&local_40,(HeapType)pHVar3->id,Nullable,Inexact);
    note(this,ppEVar5,local_40);
    ppEVar5 = &local_28->value;
    pvVar6 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::operator[]
                       (&local_38->fields,(ulong)local_28->index);
    note(this,ppEVar5,(Type)(pvVar6->type).id);
    return;
  }
  __assert_fail("curr->index < fields.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                ,0x390,
                "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStructRMW(StructRMW *, std::optional<HeapType>) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
               );
}

Assistant:

void visitStructRMW(StructRMW* curr,
                      std::optional<HeapType> ht = std::nullopt) {
    if (!ht) {
      ht = curr->ref->type.getHeapType();
    }
    const auto& fields = ht->getStruct().fields;
    assert(curr->index < fields.size());
    note(&curr->ref, Type(*ht, Nullable));
    note(&curr->value, fields[curr->index].type);
  }